

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_HookCommon.cpp
# Opt level: O1

HookAction axl::spy::hookEnterCommon(HookCommonContext *context,size_t frameBase,size_t originalRet)

{
  bool bVar1;
  HookAction HVar2;
  ThreadState *this;
  
  HVar2 = HookAction_JumpTarget;
  bVar1 = areHooksEnabled();
  if (bVar1) {
    disableCurrentThreadHooks();
    this = getCurrentThreadState(true);
    if (context->m_enterFunc == (HookEnterFunc *)0x0) {
      HVar2 = HookAction_Default;
    }
    else {
      HVar2 = (*context->m_enterFunc)(context->m_targetFunc,context->m_callbackParam,frameBase);
    }
    if (HVar2 == HookAction_Default) {
      if (context->m_leaveFunc == (HookLeaveFunc *)0x0) {
        HVar2 = HookAction_JumpTarget;
      }
      else {
        ThreadState::addFrame(this,context,frameBase,originalRet);
        HVar2 = HookAction_Default;
      }
    }
    enableCurrentThreadHooks();
  }
  return HVar2;
}

Assistant:

HookAction
hookEnterCommon(
	HookCommonContext* context,
	size_t frameBase,
	size_t originalRet
) {
	if (!areHooksEnabled())
		return HookAction_JumpTarget;

	disableCurrentThreadHooks();

	ThreadState* threadState = getCurrentThreadState();

	HookAction action = context->m_enterFunc ?
		context->m_enterFunc(context->m_targetFunc, context->m_callbackParam, frameBase) :
		HookAction_Default;

	if (action == HookAction_Default)
		if (!context->m_leaveFunc)
			action = HookAction_JumpTarget;
		else
			threadState->addFrame(context, frameBase, originalRet);

	enableCurrentThreadHooks();
	return action;
}